

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float sumfp32_1;
  float scale_in_1;
  int i_1;
  char *m_1;
  char *w_1;
  int q;
  int offset;
  int sum_1;
  float *outptr_1;
  int p_1;
  float sumfp32;
  float scale_in;
  int i;
  int sum;
  char *kptr;
  int p;
  float *outptr;
  char *m;
  int j;
  Option opt_g;
  Mat bottom_blob_int8;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int num_input;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_2;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined8 in_stack_fffffffffffffa48;
  Mat *in_stack_fffffffffffffa50;
  float local_534;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  undefined4 in_stack_fffffffffffffb50;
  float fVar8;
  undefined4 in_stack_fffffffffffffb54;
  int iVar9;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  Allocator *local_488;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined4 local_474;
  undefined4 local_470;
  undefined8 local_468;
  void *local_460;
  long local_458;
  int local_44c;
  int local_448;
  int local_444;
  long local_440;
  int local_434;
  float local_430;
  float local_42c;
  int local_428;
  int local_424;
  long local_420;
  int local_414;
  long local_410;
  void *local_408;
  int local_3fc;
  undefined4 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined4 local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  ulong local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Mat local_3a0;
  int local_354;
  long local_350;
  int local_348;
  int local_344;
  int local_340;
  int local_33c;
  long *local_330;
  long *local_328;
  int local_314;
  undefined8 *local_310;
  Mat *local_300;
  long *local_2f0;
  long *local_2e8;
  int local_2dc;
  long *local_2d8;
  long local_2d0;
  long *local_2c8;
  long local_2c0;
  long *local_2b8;
  undefined8 local_2b0;
  undefined8 *local_2a8;
  long local_2a0;
  long *local_298;
  long local_290;
  long *local_288;
  long local_280;
  long *local_278;
  undefined8 local_270;
  undefined8 *local_268;
  long local_260;
  long *local_258;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  float local_238;
  float local_234;
  float local_230;
  float local_22c;
  long *local_228;
  undefined4 local_220;
  float local_21c [3];
  long *local_210;
  undefined8 local_208;
  long *local_200;
  undefined8 local_1f8;
  long *local_1f0;
  undefined8 local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  long *local_1d0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  long *local_1a0;
  undefined4 local_198;
  float local_194 [3];
  long *local_188;
  undefined8 local_180;
  long *local_178;
  undefined8 local_170;
  long *local_168;
  undefined8 local_160;
  long *local_158;
  undefined8 local_150;
  long *local_148;
  Mat *local_138;
  int local_12c;
  Mat *local_128;
  long *local_120;
  long *local_118;
  long *local_110;
  undefined1 local_105;
  int local_104;
  Mat *local_100;
  undefined8 *local_f8;
  undefined8 *local_e8;
  int local_c0;
  undefined4 local_bc;
  Mat *local_b8;
  undefined8 *local_98;
  void *local_80;
  long *local_68;
  long *local_60;
  Allocator *local_58;
  int local_4c;
  size_t local_48;
  void *local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  int local_10;
  undefined4 local_c;
  Mat *local_8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  local_33c = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_340 = *(int *)((long)in_RSI + 0x2c);
  local_344 = (int)in_RSI[6];
  local_348 = (int)in_RSI[7];
  local_350 = in_RSI[2];
  local_354 = local_340 * local_344;
  local_138 = &local_3a0;
  local_3a0.data = (void *)*in_RSI;
  local_3a0.refcount = (int *)in_RSI[1];
  local_3a0.elemsize = in_RSI[2];
  local_3a0.elempack = (int)in_RSI[3];
  local_3a0.allocator = (Allocator *)in_RSI[4];
  local_3a0.dims = (int)in_RSI[5];
  local_3a0.w = *(int *)((long)in_RSI + 0x2c);
  local_3a0.h = (int)in_RSI[6];
  local_3a0.d = *(int *)((long)in_RSI + 0x34);
  local_3a0.c = (int)in_RSI[7];
  local_3a0.cstep = in_RSI[8];
  if (local_3a0.refcount != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_3a0.refcount;
    *local_3a0.refcount = *local_3a0.refcount + 1;
    UNLOCK();
  }
  local_330 = in_RDX;
  local_328 = in_RSI;
  local_8 = local_138;
  if (local_350 != 1) {
    local_3e8 = *in_RCX;
    local_3d8 = *(undefined4 *)(in_RCX + 2);
    uStack_3d4 = *(undefined4 *)((long)in_RCX + 0x14);
    uStack_3d0 = *(undefined4 *)(in_RCX + 3);
    uStack_3cc = *(undefined4 *)((long)in_RCX + 0x1c);
    uStack_3c0 = in_RCX[5];
    local_3b8 = in_RCX[6];
    uStack_3b0 = in_RCX[7];
    uStack_3e0 = in_RCX[2];
    local_3c8 = in_RCX[4] & 0xffffffffffffff;
    quantize_to_int8((Mat *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50),
                     (Mat *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),local_138,
                     (Option *)local_138);
  }
  iVar9 = (int)((ulong)in_stack_fffffffffffffa48 >> 0x20);
  if ((((int)local_328[5] == 2) && (local_340 == local_33c)) && (1 < local_344)) {
    Mat::create(in_stack_fffffffffffffa50,iVar9,(int)in_stack_fffffffffffffa48,
                CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                (Allocator *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_2e8 = local_330;
    bVar2 = true;
    if (*local_330 != 0) {
      local_68 = local_330;
      bVar2 = local_330[8] * (long)(int)local_330[7] == 0;
    }
    if (bVar2) {
      local_314 = -100;
    }
    else {
      for (local_3fc = 0; local_3fc < local_344; local_3fc = local_3fc + 1) {
        local_128 = &local_3a0;
        local_12c = local_3fc;
        local_408 = (void *)((long)local_3a0.data +
                            (long)local_3a0.w * (long)local_3fc * local_3a0.elemsize);
        local_2d8 = local_330;
        local_2dc = local_3fc;
        local_410 = *local_330 +
                    (long)*(int *)((long)local_330 + 0x2c) * (long)local_3fc * local_330[2];
        for (local_414 = 0; local_414 < *(int *)(in_RDI + 0xd0); local_414 = local_414 + 1) {
          local_118 = (long *)(in_RDI + 0x130);
          local_420 = *local_118 + (long)(local_340 * local_414);
          local_424 = 0;
          for (local_428 = 0; local_428 < local_340; local_428 = local_428 + 1) {
            local_424 = (int)*(char *)((long)local_408 + (long)local_428) *
                        (int)*(char *)(local_420 + local_428) + local_424;
          }
          local_258 = (long *)(in_RDI + 0x1c0);
          local_260 = (long)local_414;
          fVar8 = *(float *)(*local_258 + local_260 * 4);
          if ((fVar8 != 0.0) || (NAN(fVar8))) {
            local_268 = (undefined8 *)(in_RDI + 0x208);
            local_270 = 0;
            local_278 = (long *)(in_RDI + 0x1c0);
            local_280 = (long)local_414;
            local_42c = 1.0 / (*(float *)*local_268 * *(float *)(*local_278 + local_280 * 4));
          }
          else {
            local_42c = 0.0;
          }
          local_430 = (float)local_424 * local_42c;
          if (*(int *)(in_RDI + 0xd4) != 0) {
            local_288 = (long *)(in_RDI + 0x178);
            local_290 = (long)local_414;
            local_430 = *(float *)(*local_288 + local_290 * 4) + local_430;
          }
          fVar8 = local_430;
          local_198 = *(undefined4 *)(in_RDI + 0xe0);
          local_1a0 = (long *)(in_RDI + 0xe8);
          local_194[0] = local_430;
          switch(local_198) {
          case 1:
            dVar3 = std::fmax((double)(ulong)(uint)local_430,0.0);
            local_194[0] = SUB84(dVar3,0);
            break;
          case 2:
            local_150 = 0;
            local_1a4 = *(float *)*local_1a0;
            if (local_430 <= 0.0) {
              local_534 = local_430 * local_1a4;
            }
            else {
              local_534 = local_430;
            }
            local_194[0] = local_534;
            local_148 = local_1a0;
            break;
          case 3:
            local_160 = 0;
            local_1a8 = *(float *)*local_1a0;
            local_170 = 1;
            local_1ac = *(float *)(*local_1a0 + 4);
            if (local_430 < local_1a8) {
              local_194[0] = local_1a8;
            }
            local_168 = local_1a0;
            local_158 = local_1a0;
            if (local_1ac < local_194[0]) {
              local_194[0] = local_1ac;
            }
            break;
          case 4:
            local_1b0 = 88.37626;
            pfVar1 = std::min<float>(local_194,&local_1b0);
            local_194[0] = *pfVar1;
            local_1b4 = -88.37626;
            pfVar1 = std::max<float>(local_194,&local_1b4);
            local_194[0] = *pfVar1;
            dVar3 = std::exp((double)(ulong)(uint)-local_194[0]);
            local_194[0] = 1.0 / (SUB84(dVar3,0) + 1.0);
            break;
          case 5:
            auVar4._0_8_ = std::exp((double)(ulong)(uint)local_430);
            auVar4._8_8_ = extraout_XMM0_Qb;
            auVar5._4_12_ = auVar4._4_12_;
            auVar5._0_4_ = SUB84(auVar4._0_8_,0) + 1.0;
            dVar3 = std::log(auVar5._0_8_);
            dVar3 = std::tanh(dVar3);
            local_194[0] = fVar8 * SUB84(dVar3,0);
            break;
          case 6:
            local_180 = 0;
            local_1b8 = *(float *)*local_1a0;
            local_194[1] = 1.4013e-45;
            local_194[2] = 0.0;
            local_1bc = *(float *)(*local_1a0 + 4);
            local_1c0 = -local_1bc / local_1b8;
            local_1c4 = 1.0 / local_1b8 + local_1c0;
            local_188 = local_1a0;
            local_178 = local_1a0;
            if (local_1c0 <= local_430) {
              if (local_430 <= local_1c4) {
                local_194[0] = local_430 * (local_430 * local_1b8 + local_1bc);
              }
            }
            else {
              local_194[0] = 0.0;
            }
          }
          *(float *)(local_410 + (long)local_414 * 4) = local_194[0];
        }
      }
      local_314 = 0;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffa50,iVar9,
                CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                (Allocator *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_2f0 = local_330;
    bVar2 = true;
    if (*local_330 != 0) {
      local_60 = local_330;
      bVar2 = local_330[8] * (long)(int)local_330[7] == 0;
    }
    if (bVar2) {
      local_314 = -100;
    }
    else {
      for (local_434 = 0; local_434 < *(int *)(in_RDI + 0xd0); local_434 = local_434 + 1) {
        local_110 = local_330;
        local_440 = *local_330;
        local_444 = 0;
        local_448 = local_354 * local_348 * local_434;
        for (local_44c = 0; local_44c < local_348; local_44c = local_44c + 1) {
          local_120 = (long *)(in_RDI + 0x130);
          local_458 = *local_120 + (long)local_448 + (long)(local_354 * local_44c);
          local_f8 = &local_4a8;
          local_100 = &local_3a0;
          local_460 = (void *)((long)local_3a0.data +
                              local_3a0.cstep * (long)local_44c * local_3a0.elemsize);
          local_28 = &local_4a8;
          local_488 = local_3a0.allocator;
          local_18 = (long)local_3a0.w * (long)local_3a0.h * local_3a0.elemsize;
          local_1c = 0x10;
          local_2c = local_3a0.w;
          local_30 = local_3a0.h;
          local_34 = local_3a0.d;
          local_48 = local_3a0.elemsize;
          local_4c = local_3a0.elempack;
          local_58 = local_3a0.allocator;
          local_104 = local_44c;
          local_105 = 1;
          local_e8 = &local_4a8;
          local_310 = &local_4a8;
          local_4a8 = 0;
          local_498 = 0;
          local_490 = 0;
          local_480 = 0;
          local_47c = 0;
          local_478 = 0;
          local_474 = 0;
          local_470 = 0;
          local_468 = 0;
          local_4a0 = 0;
          for (iVar9 = 0; iVar9 < local_354; iVar9 = iVar9 + 1) {
            local_444 = (int)*(char *)((long)local_460 + (long)iVar9) *
                        (int)*(char *)(local_458 + iVar9) + local_444;
          }
          local_98 = local_310;
          local_40 = local_460;
        }
        local_298 = (long *)(in_RDI + 0x1c0);
        local_2a0 = (long)local_434;
        fVar8 = *(float *)(*local_298 + local_2a0 * 4);
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          local_2a8 = (undefined8 *)(in_RDI + 0x208);
          local_2b0 = 0;
          local_2b8 = (long *)(in_RDI + 0x1c0);
          local_2c0 = (long)local_434;
          fVar8 = 1.0 / (*(float *)*local_2a8 * *(float *)(*local_2b8 + local_2c0 * 4));
        }
        else {
          fVar8 = 0.0;
        }
        fVar8 = (float)local_444 * fVar8;
        if (*(int *)(in_RDI + 0xd4) != 0) {
          local_2c8 = (long *)(in_RDI + 0x178);
          local_2d0 = (long)local_434;
          fVar8 = *(float *)(*local_2c8 + local_2d0 * 4) + fVar8;
        }
        local_220 = *(undefined4 *)(in_RDI + 0xe0);
        local_228 = (long *)(in_RDI + 0xe8);
        local_21c[0] = fVar8;
        switch(local_220) {
        case 1:
          dVar3 = std::fmax((double)(ulong)(uint)fVar8,0.0);
          local_21c[0] = SUB84(dVar3,0);
          break;
        case 2:
          local_1d8 = 0;
          local_22c = *(float *)*local_228;
          local_1d0 = local_228;
          if (fVar8 <= 0.0) {
            local_21c[0] = fVar8 * local_22c;
          }
          break;
        case 3:
          local_1e8 = 0;
          local_230 = *(float *)*local_228;
          local_1f8 = 1;
          local_234 = *(float *)(*local_228 + 4);
          if (fVar8 < local_230) {
            local_21c[0] = local_230;
          }
          local_1f0 = local_228;
          local_1e0 = local_228;
          if (local_234 < local_21c[0]) {
            local_21c[0] = local_234;
          }
          break;
        case 4:
          local_238 = 88.37626;
          pfVar1 = std::min<float>(local_21c,&local_238);
          local_21c[0] = *pfVar1;
          local_23c = -88.37626;
          pfVar1 = std::max<float>(local_21c,&local_23c);
          local_21c[0] = *pfVar1;
          dVar3 = std::exp((double)(ulong)(uint)-local_21c[0]);
          local_21c[0] = 1.0 / (SUB84(dVar3,0) + 1.0);
          break;
        case 5:
          auVar6._0_8_ = std::exp((double)(ulong)(uint)fVar8);
          auVar6._8_8_ = extraout_XMM0_Qb_00;
          auVar7._4_12_ = auVar6._4_12_;
          auVar7._0_4_ = SUB84(auVar6._0_8_,0) + 1.0;
          dVar3 = std::log(auVar7._0_8_);
          dVar3 = std::tanh(dVar3);
          local_21c[0] = fVar8 * SUB84(dVar3,0);
          break;
        case 6:
          local_208 = 0;
          local_240 = *(float *)*local_228;
          local_21c[1] = 1.4013e-45;
          local_21c[2] = 0.0;
          local_244 = *(float *)(*local_228 + 4);
          local_248 = -local_244 / local_240;
          local_24c = 1.0 / local_240 + local_248;
          local_210 = local_228;
          local_200 = local_228;
          if (local_248 <= fVar8) {
            if (fVar8 <= local_24c) {
              local_21c[0] = fVar8 * (fVar8 * local_240 + local_244);
            }
          }
          else {
            local_21c[0] = 0.0;
          }
        }
        *(float *)(local_440 + (long)local_434 * 4) = local_21c[0];
      }
      local_314 = 0;
    }
  }
  local_3f8 = 1;
  local_300 = &local_3a0;
  if (local_3a0.refcount != (int *)0x0) {
    local_bc = 0xffffffff;
    LOCK();
    local_c0 = *local_3a0.refcount;
    *local_3a0.refcount = *local_3a0.refcount + -1;
    UNLOCK();
    if (local_c0 == 1) {
      local_b8 = local_300;
      if (local_3a0.allocator == (Allocator *)0x0) {
        local_80 = local_3a0.data;
        if (local_3a0.data != (void *)0x0) {
          free(local_3a0.data);
        }
      }
      else {
        (*(local_3a0.allocator)->_vptr_Allocator[3])(local_3a0.allocator,local_3a0.data);
      }
    }
  }
  return local_314;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;
        opt_g.use_packing_layout = false;

        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_g);
    }

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const signed char* m = bottom_blob_int8.row<signed char>(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const signed char* kptr = (const signed char*)weight_data + w * p;
                int sum = 0;

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }
                // dequantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        int offset = size * channels * p;
        // channels
        for (int q = 0; q < channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + offset + size * q;
            const signed char* m = bottom_blob_int8.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        outptr[p] = activation_ss(sumfp32, activation_type, activation_params);
    }

    return 0;
}